

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryReader.h
# Opt level: O3

uint32_t __thiscall BinaryReader::ReadUInt32(BinaryReader *this)

{
  undefined8 in_RAX;
  Error *this_00;
  uint32_t value;
  uint32_t local_14;
  
  local_14 = (uint32_t)((ulong)in_RAX >> 0x20);
  std::istream::read((char *)this->_in,(long)&local_14);
  if (((byte)this->_in[*(long *)(*(long *)this->_in + -0x18) + 0x20] & 5) == 0) {
    return local_14;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_00,"I/O Error while reading from file.");
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

uint32_t ReadUInt32( void )
	{
		uint32_t value;

		//static_assert(sizeof(value) == 4, "Invalid size of uint32_t type");

		_in.read((char*)&value, 4);

		if (_in.fail())
			throw Error("I/O Error while reading from file.");

		return value;
	}